

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.h
# Opt level: O0

void __thiscall
mp::QP2Passes::QP2Passes(QP2Passes *this,BasicProblemFlattener *flt,QP2PassVisitor *v)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  ::BasicIteratedExpr((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                       *)0x40f8e7);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x40f8f5);
  *(undefined4 *)(in_RDI + 8) = 0;
  EExpr::EExpr((EExpr *)0x40f90a);
  return;
}

Assistant:

QP2Passes(BasicProblemFlattener& flt, QP2PassVisitor& v)
      : flattener_(flt), visitor_(v) { }